

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

void trb_print_entire_node
               (trt_node *node,uint32_t max_gap_before_type,trt_wrapper wr,trt_printer_ctx *pc,
               trt_tree_ctx *tc)

{
  ly_bool lVar1;
  trt_type_type tVar2;
  trt_iffeatures_type tVar3;
  char *__s;
  ly_out *out;
  char *pcVar4;
  _func_void_trt_tree_ctx_ptr_ly_out_ptr *p_Var5;
  _func_void_trt_tree_ctx_ptr_ly_out_ptr *p_Var6;
  trt_pck_print pck;
  trt_pck_print pck_00;
  trt_pck_print pck_01;
  trt_pck_print ppck;
  trt_pck_indent indent;
  trt_pck_indent indent_00;
  trt_pck_indent ipck;
  trt_wrapper wr_00;
  ulong uVar7;
  uint32_t uVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  trt_node *ptVar12;
  trt_node *ptVar13;
  trt_node *ptVar14;
  ulong uVar15;
  bool bVar16;
  byte bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  trt_wrapper local_188;
  undefined8 uStack_170;
  int16_t local_168;
  undefined2 uStack_166;
  undefined4 uStack_164;
  trt_wrapper local_158;
  ulong uStack_140;
  ushort local_138;
  undefined2 uStack_136;
  undefined4 uStack_134;
  trt_node node_1;
  trt_pair_indent_node local_c8;
  trt_wrapper local_58;
  undefined8 uStack_40;
  int16_t local_38;
  undefined2 uStack_36;
  undefined4 uStack_34;
  
  wr_00 = wr;
  bVar17 = 0;
  lVar1 = (node->name).keys;
  tVar2 = (node->type).type;
  if (tVar2 == TRD_TYPE_EMPTY) {
    uVar15 = 0;
  }
  else {
    uVar15 = 0x4000000000000;
    if ((((node->name).str != (char *)0x0) && (lVar1 == '\0')) &&
       (TRD_NODE_CASE < (node->name).type)) {
      pcVar4 = (node->name).add_opts;
      __s = (node->name).opts;
      if (pcVar4 != (char *)0x0 || __s != (char *)0x0) {
        if (pcVar4 == (char *)0x0) {
          sVar9 = 0;
        }
        else {
          sVar9 = strlen(pcVar4);
        }
        if (__s == (char *)0x0) {
          sVar10 = 0;
        }
        else {
          sVar10 = strlen(__s);
        }
        uVar15 = 0x4000000000000 - (sVar10 + sVar9 << 0x30);
        if ((sVar10 + sVar9 & 0xfffffffc) == 0) {
          uVar15 = 0x1000000000000;
        }
      }
    }
  }
  tVar3 = (node->iffeatures).type;
  if (max_gap_before_type == 0 || tVar2 == TRD_TYPE_EMPTY) {
    uVar15 = uVar15 >> 0x30;
  }
  else {
    uVar8 = trb_gap_to_opts(node);
    uVar15 = 1;
    if (uVar8 != 0) {
      uVar15 = (ulong)(max_gap_before_type - uVar8 & 0xffff);
    }
  }
  p_Var5 = (pc->fp).print.print_features_names;
  p_Var6 = (pc->fp).print.print_keys;
  local_158.actual_pos = wr.actual_pos;
  local_158._20_4_ = wr._20_4_;
  local_158.type = wr.type;
  local_158._4_4_ = wr._4_4_;
  local_158.bit_marks1 = wr.bit_marks1;
  uStack_140 = (ulong)(lVar1 != '\0') << 0x20 | uVar15 << 0x30;
  out = pc->out;
  uVar15 = pc->max_line_length;
  local_138 = (ushort)(tVar3 == TRD_IFF_PRESENT);
  ptVar13 = &node_1;
  for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
    ptVar13->status = node->status;
    node = (trt_node *)((long)node + (ulong)bVar17 * -0x10 + 8);
    ptVar13 = (trt_node *)((long)ptVar13 + (ulong)bVar17 * -0x10 + 8);
  }
  if (node_1.type.type == TRD_TYPE_TARGET) {
    pcVar4 = (out->method).fpath.filepath;
    pcVar4[0x10] = '\0';
    pcVar4[0x11] = '\0';
    pcVar4[0x12] = '\0';
    pcVar4[0x13] = '\0';
    pcVar4[0x14] = '\0';
    pcVar4[0x15] = '\0';
    pcVar4[0x16] = '\0';
    pcVar4[0x17] = '\0';
    pcVar4[0] = '\x01';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    trp_print_wrapper(wr_00,out);
    ly_print_(out,"%*c",2,0x20);
    bVar16 = false;
    trp_print_divided_node_up_to_name(&node_1,out);
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    sVar9 = strlen(node_1.type.str);
    if (uVar15 < sVar9 + *(long *)(pcVar4 + 0x10)) {
      node_1.type.type = TRD_TYPE_LEAFREF;
      bVar16 = false;
    }
  }
  else {
    bVar16 = node_1.type.type == TRD_TYPE_EMPTY;
  }
  ptVar13 = &local_c8.node;
  local_c8.indent.btw_type_iffeatures = local_138;
  local_c8.indent._10_2_ = uStack_136;
  local_c8.indent.type = (undefined4)uStack_140;
  local_c8.indent.btw_name_opts = uStack_140._4_2_;
  local_c8.indent.btw_opts_type = uStack_140._6_2_;
  ptVar12 = &node_1;
  ptVar14 = ptVar13;
  for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
    ptVar14->status = ptVar12->status;
    ptVar12 = (trt_node *)((long)ptVar12 + (ulong)bVar17 * -0x10 + 8);
    ptVar14 = (trt_node *)((long)ptVar14 + (ulong)bVar17 * -0x10 + 8);
  }
  pcVar4 = (out->method).fpath.filepath;
  pcVar4[0x10] = '\0';
  pcVar4[0x11] = '\0';
  pcVar4[0x12] = '\0';
  pcVar4[0x13] = '\0';
  pcVar4[0x14] = '\0';
  pcVar4[0x15] = '\0';
  pcVar4[0x16] = '\0';
  pcVar4[0x17] = '\0';
  pcVar4[0] = '\x01';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pck.fps.print_features_names = p_Var5;
  pck.tree_ctx = tc;
  pck.fps.print_keys = p_Var6;
  trp_try_normal_indent_in_node_(pck,wr_00,uVar15,(size_t *)(pcVar4 + 0x10),out,&local_c8);
  pcVar4[0] = '\0';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  if (local_c8.indent.type == TRD_INDENT_IN_NODE_FAILED) {
    trp_print_wrapper(wr_00,out);
    trp_print_node_up_to_name(&node_1,out);
    if ((bVar16 && node_1.iffeatures.type == TRD_IFF_NON_PRESENT) && (node_1.name.keys == '\0')) {
      return;
    }
    ly_print_(out,"\n");
    ptVar12 = &node_1;
    ptVar14 = ptVar13;
    for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
      ptVar14->status = ptVar12->status;
      ptVar12 = (trt_node *)((long)ptVar12 + (ulong)bVar17 * -0x10 + 8);
      ptVar14 = (trt_node *)((long)ptVar14 + (ulong)bVar17 * -0x10 + 8);
    }
    trp_second_half_node(&local_c8);
    local_c8.indent.type = 1;
    trp_wrapper_if_last_sibling(&local_188,wr_00,node_1.last_one);
    local_168 = local_c8.indent.btw_type_iffeatures;
    uStack_166 = local_c8.indent._10_2_;
    uStack_170._0_4_ = local_c8.indent.type;
    uStack_170._4_2_ = local_c8.indent.btw_name_opts;
    uStack_170._6_2_ = local_c8.indent.btw_opts_type;
    uVar7 = uStack_170;
    uVar20 = CONCAT44(uStack_164,local_c8.indent._8_4_);
    uStack_170._0_4_ = local_c8.indent.type;
    uStack_170._4_4_ = local_c8.indent._4_4_;
    local_58.type = local_188.type;
    local_58._4_4_ = local_188._4_4_;
    local_58.bit_marks1._0_4_ = (undefined4)local_188.bit_marks1;
    local_58.bit_marks1._4_4_ = local_188.bit_marks1._4_4_;
    local_58.actual_pos = local_188.actual_pos;
    local_58._20_4_ = local_188._20_4_;
    uVar18 = (undefined4)uStack_170;
    uVar19 = uStack_170._4_4_;
    uStack_170 = uVar7;
  }
  else {
    if (local_c8.indent.type != TRD_INDENT_IN_NODE_DIVIDED) {
      if (local_c8.indent.type != TRD_INDENT_IN_NODE_NORMAL) {
        return;
      }
      indent.in_node._10_2_ = uStack_136;
      indent.in_node.btw_type_iffeatures = local_138;
      indent._36_4_ = uStack_134;
      uVar18 = (undefined4)(uStack_140 >> 0x20);
      pck_00.fps.print_features_names = p_Var5;
      pck_00.tree_ctx = tc;
      pck_00.fps.print_keys = p_Var6;
      indent.wrapper.bit_marks1._0_4_ = (int)local_158.bit_marks1;
      indent.wrapper.type = local_158.type;
      indent.wrapper._4_4_ = local_158._4_4_;
      indent.wrapper.bit_marks1._4_4_ = (int)(local_158.bit_marks1 >> 0x20);
      indent.wrapper.actual_pos = local_158.actual_pos;
      indent.wrapper._20_4_ = local_158._20_4_;
      indent.in_node.type = (int)uStack_140;
      indent.in_node.btw_name_opts = (short)uVar18;
      indent.in_node.btw_opts_type = (short)((uint)uVar18 >> 0x10);
      trp_print_line(&node_1,pck_00,indent,out);
      return;
    }
    local_188.actual_pos = wr.actual_pos;
    local_188._20_4_ = wr._20_4_;
    local_188.type = wr.type;
    local_188._4_4_ = wr._4_4_;
    local_188.bit_marks1 = wr.bit_marks1;
    local_168 = local_c8.indent.btw_type_iffeatures;
    uStack_166 = local_c8.indent._10_2_;
    uStack_170 = local_c8.indent._0_8_ & 0xffffffff00000000;
    indent_00._36_4_ = uStack_164;
    indent_00.in_node.btw_type_iffeatures = local_c8.indent.btw_type_iffeatures;
    indent_00.in_node._10_2_ = local_c8.indent._10_2_;
    pck_01.fps.print_features_names = p_Var5;
    pck_01.tree_ctx = tc;
    pck_01.fps.print_keys = p_Var6;
    indent_00.in_node.type = 0;
    indent_00.wrapper = wr_00;
    indent_00.in_node.btw_name_opts = (short)local_c8.indent._4_4_;
    indent_00.in_node.btw_opts_type = (short)((uint)local_c8.indent._4_4_ >> 0x10);
    trp_print_line(ptVar13,pck_01,indent_00,out);
    ly_print_(out,"\n");
    ptVar12 = &node_1;
    ptVar14 = ptVar13;
    for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
      ptVar14->status = ptVar12->status;
      ptVar12 = (trt_node *)((long)ptVar12 + (ulong)bVar17 * -0x10 + 8);
      ptVar14 = (trt_node *)((long)ptVar14 + (ulong)bVar17 * -0x10 + 8);
    }
    trp_second_half_node(&local_c8);
    trp_wrapper_if_last_sibling(&local_58,wr_00,node_1.last_one);
    local_38 = local_c8.indent.btw_type_iffeatures;
    uStack_36 = local_c8.indent._10_2_;
    uStack_40._0_4_ = local_c8.indent.type;
    uStack_40._4_2_ = local_c8.indent.btw_name_opts;
    uStack_40._6_2_ = local_c8.indent.btw_opts_type;
    uVar7 = uStack_40;
    uVar20 = CONCAT44(uStack_34,local_c8.indent._8_4_);
    uStack_40._0_4_ = local_c8.indent.type;
    uStack_40._4_4_ = local_c8.indent._4_4_;
    uVar18 = (undefined4)uStack_40;
    uVar19 = uStack_40._4_4_;
    uStack_40 = uVar7;
  }
  ppck.fps.print_features_names = p_Var5;
  ppck.tree_ctx = tc;
  ppck.fps.print_keys = p_Var6;
  ipck.wrapper._4_4_ = local_58._4_4_;
  ipck.wrapper.type = local_58.type;
  ipck.wrapper.bit_marks1._0_4_ = (undefined4)local_58.bit_marks1;
  ipck.wrapper.bit_marks1._4_4_ = local_58.bit_marks1._4_4_;
  ipck.wrapper.actual_pos = local_58.actual_pos;
  ipck.wrapper._20_4_ = local_58._20_4_;
  ipck.in_node.type = uVar18;
  ipck.in_node.btw_name_opts = (short)uVar19;
  ipck.in_node.btw_opts_type = (short)((uint)uVar19 >> 0x10);
  ipck.in_node.btw_type_iffeatures = (short)uVar20;
  ipck.in_node._10_2_ = (short)((ulong)uVar20 >> 0x10);
  ipck._36_4_ = (int)((ulong)uVar20 >> 0x20);
  trp_print_divided_node(ptVar13,ppck,ipck,uVar15,out);
  return;
}

Assistant:

static void
trb_print_entire_node(const struct trt_node *node, uint32_t max_gap_before_type, struct trt_wrapper wr,
        struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    struct trt_indent_in_node ind = trp_default_indent_in_node(node);

    if ((max_gap_before_type > 0) && (node->type.type != TRD_TYPE_EMPTY)) {
        /* print actual node with unified indent */
        ind.btw_opts_type = trb_calc_btw_opts_type(node, max_gap_before_type);
    }
    /* after -> print actual node with default indent */
    trp_print_entire_node(node, TRP_INIT_PCK_PRINT(tc, pc->fp.print),
            TRP_INIT_PCK_INDENT(wr, ind), pc->max_line_length, pc->out);
}